

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execAddEaRg<(moira::Instr)118,(moira::Mode)5,(moira::Size)1>(Moira *this,u16 opcode)

{
  uint uVar1;
  byte bVar2;
  byte bVar3;
  u32 uVar4;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar4 = computeEA<(moira::Mode)5,(moira::Size)1,0ul>(this,opcode & 7);
  uVar4 = readM<(moira::MemSpace)1,(moira::Size)1,128ul>(this,uVar4);
  uVar6 = (ulong)(opcode >> 9 & 7);
  uVar1 = *(uint *)((long)this->exec + uVar6 * 4 + -0x58);
  uVar7 = (ulong)(uVar1 & 0xff) - (ulong)uVar4;
  bVar5 = (bool)((byte)(uVar7 >> 8) & 1);
  (this->reg).sr.c = bVar5;
  (this->reg).sr.x = bVar5;
  bVar3 = (byte)uVar1;
  bVar2 = (byte)uVar7;
  (this->reg).sr.v = (bool)((byte)((bVar2 ^ bVar3) & ((byte)uVar4 ^ bVar3)) >> 7);
  (this->reg).sr.z = bVar2 == 0;
  (this->reg).sr.n = (bool)((byte)((uVar7 & 0xffffffff) >> 7) & 1);
  uVar4 = (this->reg).pc;
  (this->reg).pc0 = uVar4;
  (this->queue).ird = (this->queue).irc;
  uVar4 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar4 + 2);
  (this->queue).irc = (u16)uVar4;
  *(byte *)((long)this->exec + uVar6 * 4 + -0x58) = bVar2;
  return;
}

Assistant:

void
Moira::execAddEaRg(u16 opcode)
{
    u32 ea, data, result;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp<M,S, STD_AE_FRAME>(src, ea, data)) return;
    
    result = addsub<I,S>(data, readD<S>(dst));
    prefetch<POLLIPL>();
    
    if (S == Long) sync(2 + (isMemMode(M) ? 0 : 2));
    writeD<S>(dst, result);
}